

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::handle(Fl_Text_Display *this,int event)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Fl_Text_Buffer *pFVar5;
  Fl_Window *pFVar6;
  Fl_Text_Display *pFVar7;
  Fl_Text_Selection *pFVar8;
  Fl_Text_Buffer *this_00;
  EVP_PKEY_CTX *pEVar9;
  size_t sVar10;
  Fl_Text_Buffer *pFVar11;
  uint *__writefds;
  fd_set *__writefds_00;
  fd_set *in_R8;
  timeval *in_R9;
  int local_c4;
  char *copy_3;
  char *copy_2;
  int end_2;
  int start_2;
  int end_1;
  int start_1;
  int end;
  int start;
  char *copy_1;
  int local_30;
  int pos_1;
  int Y;
  int X;
  char *copy;
  int pos;
  int event_local;
  Fl_Text_Display *this_local;
  
  copy._4_4_ = event;
  _pos = this;
  pFVar5 = buffer(this);
  if (pFVar5 == (Fl_Text_Buffer *)0x0) {
    return 0;
  }
  iVar2 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,
                           (this->text_area).h);
  if ((((((iVar2 == 0) && (this->dragging == 0)) && (copy._4_4_ != 4)) &&
       ((copy._4_4_ != 3 && (copy._4_4_ != 0xb)))) &&
      ((copy._4_4_ != 6 && ((copy._4_4_ != 7 && (copy._4_4_ != 8)))))) && (copy._4_4_ != 9)) {
    iVar2 = Fl_Group::handle(&this->super_Fl_Group,copy._4_4_);
    return iVar2;
  }
  __writefds = &switchD_00225c08::switchdataD_0028d598;
  switch(copy._4_4_) {
  case 1:
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    if ((iVar2 != 0) && (pFVar6 = Fl_Widget::window((Fl_Widget *)this), pFVar6 != (Fl_Window *)0x0))
    {
      iVar2 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,
                               (this->text_area).h);
      if (iVar2 == 0) {
        pFVar6 = Fl_Widget::window((Fl_Widget *)this);
        Fl_Window::cursor(pFVar6,FL_CURSOR_DEFAULT);
      }
      else {
        pFVar6 = Fl_Widget::window((Fl_Widget *)this);
        Fl_Window::cursor(pFVar6,FL_CURSOR_INSERT);
      }
    }
    pFVar7 = (Fl_Text_Display *)Fl::focus();
    if (pFVar7 != this) {
      Fl::focus((Fl_Widget *)this);
      (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
    }
    iVar2 = Fl_Group::handle(&this->super_Fl_Group,copy._4_4_);
    if (iVar2 == 0) {
      uVar4 = Fl::event_state();
      if ((uVar4 & 0x10000) == 0) {
        this->dragging = 1;
        iVar2 = Fl::event_x();
        iVar3 = Fl::event_y();
        copy._0_4_ = xy_to_position(this,iVar2,iVar3,0);
        this->dragPos = (int)copy;
        pFVar5 = buffer(this);
        pFVar8 = Fl_Text_Buffer::primary_selection(pFVar5);
        iVar2 = Fl_Text_Selection::includes(pFVar8,(int)copy);
        if (iVar2 == 0) {
          uVar4 = Fl::event_clicks();
          __writefds_00 = (fd_set *)(ulong)uVar4;
          this->dragType = uVar4;
          if (this->dragType == 0) {
            pFVar5 = buffer(this);
            Fl_Text_Buffer::unselect(pFVar5);
          }
          else if (this->dragType == 1) {
            pFVar5 = buffer(this);
            iVar2 = word_start(this,(int)copy);
            uVar4 = word_end(this,(int)copy);
            Fl_Text_Buffer::select(pFVar5,iVar2,(fd_set *)(ulong)uVar4,__writefds_00,in_R8,in_R9);
            iVar2 = word_start(this,(int)copy);
            this->dragPos = iVar2;
          }
          pFVar5 = buffer(this);
          pFVar8 = Fl_Text_Buffer::primary_selection(pFVar5);
          bVar1 = Fl_Text_Selection::selected(pFVar8);
          if (bVar1) {
            pFVar5 = buffer(this);
            pFVar8 = Fl_Text_Buffer::primary_selection(pFVar5);
            iVar2 = Fl_Text_Selection::end(pFVar8);
            insert_position(this,iVar2);
          }
          else {
            insert_position(this,(int)copy);
          }
          show_insert_position(this);
          this_local._4_4_ = 1;
        }
        else {
          this->dragType = -1;
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,5);
      }
    }
    else {
      this_local._4_4_ = 1;
    }
    break;
  case 2:
    iVar2 = Fl::event_is_click();
    if ((iVar2 != 0) && (iVar2 = Fl::event_clicks(), iVar2 == 0)) {
      pFVar5 = buffer(this);
      pFVar8 = Fl_Text_Buffer::primary_selection(pFVar5);
      iVar2 = Fl_Text_Selection::includes(pFVar8,this->dragPos);
      if ((iVar2 != 0) && (uVar4 = Fl::event_state(), (uVar4 & 0x10000) == 0)) {
        pFVar5 = buffer(this);
        Fl_Text_Buffer::unselect(pFVar5);
        insert_position(this,this->dragPos);
        return 1;
      }
    }
    iVar2 = Fl::event_clicks();
    if ((iVar2 == 2) && (iVar2 = Fl::event_button(), iVar2 == 1)) {
      pFVar5 = buffer(this);
      pFVar11 = buffer(this);
      iVar2 = Fl_Text_Buffer::line_start(pFVar11,this->dragPos);
      pFVar11 = buffer(this);
      this_00 = buffer(this);
      iVar3 = Fl_Text_Buffer::line_end(this_00,this->dragPos);
      uVar4 = Fl_Text_Buffer::next_char(pFVar11,iVar3);
      Fl_Text_Buffer::select(pFVar5,iVar2,(fd_set *)(ulong)uVar4,(fd_set *)__writefds,in_R8,in_R9);
      iVar2 = line_start(this,this->dragPos);
      this->dragPos = iVar2;
      this->dragType = 0;
    }
    else {
      this->dragging = 0;
      if (scroll_direction != 0) {
        Fl::remove_timeout(scroll_timer_cb,this);
        scroll_direction = 0;
      }
      this->dragType = 0;
    }
    pFVar5 = buffer(this);
    pEVar9 = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(pFVar5);
    _end = pEVar9;
    if (*pEVar9 != (EVP_PKEY_CTX)0x0) {
      sVar10 = strlen((char *)pEVar9);
      Fl::copy(pEVar9,(EVP_PKEY_CTX *)(sVar10 & 0xffffffff));
    }
    free(_end);
    this_local._4_4_ = 1;
    break;
  case 3:
  case 0xb:
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar2 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      iVar2 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,
                               (this->text_area).h);
      if (iVar2 == 0) {
        pFVar6 = Fl_Widget::window((Fl_Widget *)this);
        Fl_Window::cursor(pFVar6,FL_CURSOR_DEFAULT);
      }
      else {
        pFVar6 = Fl_Widget::window((Fl_Widget *)this);
        Fl_Window::cursor(pFVar6,FL_CURSOR_INSERT);
      }
      this_local._4_4_ = 1;
    }
    break;
  case 4:
  case 0xf:
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    if ((iVar2 == 0) || (pFVar6 = Fl_Widget::window((Fl_Widget *)this), pFVar6 == (Fl_Window *)0x0))
    {
      this_local._4_4_ = 0;
    }
    else {
      pFVar6 = Fl_Widget::window((Fl_Widget *)this);
      Fl_Window::cursor(pFVar6,FL_CURSOR_DEFAULT);
      this_local._4_4_ = 1;
    }
    break;
  case 5:
    if (this->dragType == -2) {
      this_local._4_4_ = 1;
    }
    else if (this->dragType == -1) {
      iVar2 = Fl::event_is_click();
      if ((iVar2 == 0) && (iVar2 = Fl::dnd_text_ops(), iVar2 != 0)) {
        pFVar5 = buffer(this);
        _Y = Fl_Text_Buffer::selection_text(pFVar5);
        Fl::dnd();
        free(_Y);
      }
      this_local._4_4_ = 1;
    }
    else {
      pos_1 = Fl::event_x();
      local_30 = Fl::event_y();
      copy_1._4_4_ = insert_position(this);
      if (local_30 < (this->text_area).y) {
        scroll_x = pos_1;
        scroll_amount = (local_30 - (this->text_area).y) / 5 + -1;
        if (scroll_direction == 0) {
          Fl::add_timeout(0.01,scroll_timer_cb,this);
        }
        scroll_direction = 3;
      }
      else if (local_30 < (this->text_area).y + (this->text_area).h) {
        if (pos_1 < (this->text_area).x) {
          scroll_y = local_30;
          scroll_amount = (pos_1 - (this->text_area).x) / 2 + -1;
          if (scroll_direction == 0) {
            Fl::add_timeout(0.01,scroll_timer_cb,this);
          }
          scroll_direction = 2;
        }
        else if (pos_1 < (this->text_area).x + (this->text_area).w) {
          if (scroll_direction != 0) {
            Fl::remove_timeout(scroll_timer_cb,this);
            scroll_direction = 0;
          }
          copy_1._4_4_ = xy_to_position(this,pos_1,local_30,0);
          pFVar5 = buffer(this);
          copy_1._4_4_ = Fl_Text_Buffer::next_char(pFVar5,copy_1._4_4_);
        }
        else {
          scroll_y = local_30;
          scroll_amount = ((pos_1 - (this->text_area).x) - (this->text_area).w) / 2 + 1;
          if (scroll_direction == 0) {
            Fl::add_timeout(0.01,scroll_timer_cb,this);
          }
          scroll_direction = 1;
        }
      }
      else {
        scroll_x = pos_1;
        scroll_amount = ((local_30 - (this->text_area).y) - (this->text_area).h) / 5 + 1;
        if (scroll_direction == 0) {
          Fl::add_timeout(0.01,scroll_timer_cb,this);
        }
        scroll_direction = 4;
      }
      fl_text_drag_me(copy_1._4_4_,this);
      this_local._4_4_ = 1;
    }
    break;
  case 7:
    iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
    if ((iVar2 != 0) && (pFVar6 = Fl_Widget::window((Fl_Widget *)this), pFVar6 != (Fl_Window *)0x0))
    {
      pFVar6 = Fl_Widget::window((Fl_Widget *)this);
      Fl_Window::cursor(pFVar6,FL_CURSOR_DEFAULT);
    }
  case 6:
    pFVar5 = buffer(this);
    iVar2 = Fl_Text_Buffer::selected(pFVar5);
    if (iVar2 != 0) {
      pFVar5 = buffer(this);
      iVar2 = Fl_Text_Buffer::selection_position(pFVar5,&start_1,&end_1);
      if (iVar2 != 0) {
        redisplay_range(this,start_1,end_1);
      }
    }
    pFVar5 = buffer(this);
    iVar2 = Fl_Text_Buffer::secondary_selected(pFVar5);
    if (iVar2 != 0) {
      pFVar5 = buffer(this);
      iVar2 = Fl_Text_Buffer::secondary_selection_position(pFVar5,&start_2,&end_2);
      if (iVar2 != 0) {
        redisplay_range(this,start_2,end_2);
      }
    }
    pFVar5 = buffer(this);
    iVar2 = Fl_Text_Buffer::highlight(pFVar5);
    if (iVar2 != 0) {
      pFVar5 = buffer(this);
      iVar2 = Fl_Text_Buffer::highlight_position(pFVar5,(int *)((long)&copy_2 + 4),(int *)&copy_2);
      if (iVar2 != 0) {
        redisplay_range(this,copy_2._4_4_,(int)copy_2);
      }
    }
    return 1;
  case 8:
    uVar4 = Fl::event_state();
    if (((uVar4 & 0x40000) != 0) && (iVar2 = Fl::event_key(), iVar2 == 99)) {
      pFVar5 = buffer(this);
      iVar2 = Fl_Text_Buffer::selected(pFVar5);
      if (iVar2 == 0) {
        return 1;
      }
      pFVar5 = buffer(this);
      pEVar9 = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(pFVar5);
      if (*pEVar9 != (EVP_PKEY_CTX)0x0) {
        sVar10 = strlen((char *)pEVar9);
        Fl::copy(pEVar9,(EVP_PKEY_CTX *)(sVar10 & 0xffffffff));
      }
      free(pEVar9);
      return 1;
    }
    uVar4 = Fl::event_state();
    if (((uVar4 & 0x40000) != 0) && (iVar2 = Fl::event_key(), iVar2 == 0x61)) {
      pFVar5 = buffer(this);
      pFVar11 = buffer(this);
      uVar4 = Fl_Text_Buffer::length(pFVar11);
      Fl_Text_Buffer::select(pFVar5,0,(fd_set *)(ulong)uVar4,(fd_set *)__writefds,in_R8,in_R9);
      pFVar5 = buffer(this);
      pEVar9 = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(pFVar5);
      if (*pEVar9 != (EVP_PKEY_CTX)0x0) {
        sVar10 = strlen((char *)pEVar9);
        Fl::copy(pEVar9,(EVP_PKEY_CTX *)(sVar10 & 0xffffffff));
      }
      free(pEVar9);
      return 1;
    }
    iVar2 = (*(this->mVScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget
              [3])(this->mVScrollBar,(ulong)copy._4_4_);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = (*(this->mHScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget
              [3])(this->mHScrollBar,(ulong)copy._4_4_);
    if (iVar2 != 0) {
      return 1;
    }
  default:
switchD_00225c08_caseD_9:
    this_local._4_4_ = 0;
    break;
  case 0xc:
    iVar2 = shortcut(this);
    if (iVar2 == 0) {
      local_c4 = Fl_Widget::test_shortcut((Fl_Widget *)this);
    }
    else {
      uVar4 = shortcut(this);
      local_c4 = Fl::test_shortcut(uVar4);
    }
    if (local_c4 == 0) {
      return 0;
    }
    iVar2 = Fl::visible_focus();
    if ((iVar2 != 0) &&
       (iVar2 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,6), iVar2 != 0)) {
      Fl::focus((Fl_Widget *)this);
      return 1;
    }
    goto switchD_00225c08_caseD_9;
  case 0x13:
    iVar2 = Fl::event_dy();
    if (iVar2 == 0) {
      this_local._4_4_ =
           (*(this->mHScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget
             [3])(this->mHScrollBar,(ulong)copy._4_4_);
    }
    else {
      this_local._4_4_ =
           (*(this->mVScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget
             [3])(this->mVScrollBar,(ulong)copy._4_4_);
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::handle(int event) {
  if (!buffer()) return 0;
  // This isn't very elegant!
  if (!Fl::event_inside(text_area.x, text_area.y, text_area.w, text_area.h) &&
      !dragging && event != FL_LEAVE && event != FL_ENTER &&
      event != FL_MOVE && event != FL_FOCUS && event != FL_UNFOCUS &&
      event != FL_KEYBOARD && event != FL_KEYUP) {
    return Fl_Group::handle(event);
  }

  switch (event) {
    case FL_ENTER:
    case FL_MOVE:
      if (active_r()) {
        if (Fl::event_inside(text_area.x, text_area.y, text_area.w,
	                     text_area.h)) window()->cursor(FL_CURSOR_INSERT);
	else window()->cursor(FL_CURSOR_DEFAULT);
	return 1;
      } else {
        return 0;
      }

    case FL_LEAVE:
    case FL_HIDE:
      if (active_r() && window()) {
        window()->cursor(FL_CURSOR_DEFAULT);

	return 1;
      } else {
	return 0;
      }

    case FL_PUSH: {
      if (active_r() && window()) {
        if (Fl::event_inside(text_area.x, text_area.y, text_area.w,
                             text_area.h)) window()->cursor(FL_CURSOR_INSERT);
        else window()->cursor(FL_CURSOR_DEFAULT);
      }

      if (Fl::focus() != this) {
        Fl::focus(this);
        handle(FL_FOCUS);
      }
      if (Fl_Group::handle(event)) return 1;
      if (Fl::event_state()&FL_SHIFT) return handle(FL_DRAG);
      dragging = 1;
      int pos = xy_to_position(Fl::event_x(), Fl::event_y(), CURSOR_POS);
      dragPos = pos;
      if (buffer()->primary_selection()->includes(pos)) {
        dragType = DRAG_START_DND;
        return 1;
      }
      dragType = Fl::event_clicks();
      if (dragType == DRAG_CHAR) {
        buffer()->unselect();
//	Fl::copy("", 0, 0); /* removed for STR 2668 */
      }
      else if (dragType == DRAG_WORD) {
        buffer()->select(word_start(pos), word_end(pos));
	dragPos = word_start(pos);
	}

      if (buffer()->primary_selection()->selected())
        insert_position(buffer()->primary_selection()->end());
      else
        insert_position(pos);
      show_insert_position();
      return 1;
    }

    case FL_DRAG: {
      if (dragType==DRAG_NONE)
        return 1;
      if (dragType==DRAG_START_DND) {
        if (!Fl::event_is_click() && Fl::dnd_text_ops()) {
          const char* copy = buffer()->selection_text();
#ifdef __APPLE__
          Fl_X::dnd(1);
#else
          Fl::dnd();
#endif
          free((void*)copy);
        }
        return 1;
      }
      int X = Fl::event_x(), Y = Fl::event_y(), pos = insert_position();
      // if we leave the text_area, we start a timer event
      // that will take care of scrolling and selecting
      if (Y < text_area.y) {
        scroll_x = X;
        scroll_amount = (Y - text_area.y) / 5 - 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 3;
      } else if (Y >= text_area.y+text_area.h) {
        scroll_x = X;
        scroll_amount = (Y - text_area.y - text_area.h) / 5 + 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 4;
      } else if (X < text_area.x) {
        scroll_y = Y;
        scroll_amount = (X - text_area.x) / 2 - 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 2;
      } else if (X >= text_area.x+text_area.w) {
        scroll_y = Y;
        scroll_amount = (X - text_area.x - text_area.w) / 2 + 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 1;
      } else {
        if (scroll_direction) {
          Fl::remove_timeout(scroll_timer_cb, this);
          scroll_direction = 0;
        }
        pos = xy_to_position(X, Y, CURSOR_POS);
        pos = buffer()->next_char(pos);
      }
      fl_text_drag_me(pos, this);
      return 1;
    }

    case FL_RELEASE: {
      if (Fl::event_is_click() && (! Fl::event_clicks()) &&
	  buffer()->primary_selection()->includes(dragPos) && !(Fl::event_state()&FL_SHIFT) ) {
	buffer()->unselect(); // clicking in the selection: unselect and move cursor
	insert_position(dragPos);
	return 1;
      } else if (Fl::event_clicks() == DRAG_LINE && Fl::event_button() == FL_LEFT_MOUSE) {
        buffer()->select(buffer()->line_start(dragPos), buffer()->next_char(buffer()->line_end(dragPos)));
	dragPos = line_start(dragPos);
	dragType = DRAG_CHAR;
      } else {
	dragging = 0;
	if (scroll_direction) {
	  Fl::remove_timeout(scroll_timer_cb, this);
	  scroll_direction = 0;
	}

	// convert from WORD or LINE selection to CHAR
	/*if (insert_position() >= dragPos)
	  dragPos = buffer()->primary_selection()->start();
	else
	  dragPos = buffer()->primary_selection()->end();*/
	dragType = DRAG_CHAR;
      }

      const char* copy = buffer()->selection_text();
      if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
      free((void*)copy);
      return 1;
    }

    case FL_MOUSEWHEEL:
      if (Fl::event_dy()) return mVScrollBar->handle(event);
      else return mHScrollBar->handle(event);

    case FL_UNFOCUS:
      if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    case FL_FOCUS:
      if (buffer()->selected()) {
        int start, end;
        if (buffer()->selection_position(&start, &end))
          redisplay_range(start, end);
      }
      if (buffer()->secondary_selected()) {
        int start, end;
        if (buffer()->secondary_selection_position(&start, &end))
          redisplay_range(start, end);
      }
      if (buffer()->highlight()) {
        int start, end;
        if (buffer()->highlight_position(&start, &end))
          redisplay_range(start, end);
      }
      return 1;

    case FL_KEYBOARD:
      // Copy?
      if ((Fl::event_state()&(FL_CTRL|FL_COMMAND)) && Fl::event_key()=='c') {
        if (!buffer()->selected()) return 1;
        const char *copy = buffer()->selection_text();
        if (*copy) Fl::copy(copy, (int) strlen(copy), 1);
        free((void*)copy);
        return 1;
      }

      // Select all ?
      if ((Fl::event_state()&(FL_CTRL|FL_COMMAND)) && Fl::event_key()=='a') {
        buffer()->select(0,buffer()->length());
        const char *copy = buffer()->selection_text();
        if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
        free((void*)copy);
        return 1;
      }

      if (mVScrollBar->handle(event)) return 1;
      if (mHScrollBar->handle(event)) return 1;

      break;

    case FL_SHORTCUT:
      if (!(shortcut() ? Fl::test_shortcut(shortcut()) : test_shortcut()))
        return 0;
      if (Fl::visible_focus() && handle(FL_FOCUS)) {
        Fl::focus(this);
        return 1;
      }
      break;

  }

  return 0;
}